

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_next.c
# Opt level: O0

int mpt_slice_next(mpt_slice *s)

{
  mpt_buffer *pmVar1;
  mpt_type_traits *pmVar2;
  mpt_type_traits *pmVar3;
  void *__s;
  void *pvVar4;
  size_t local_40;
  ssize_t len;
  char *end;
  char *base;
  mpt_type_traits *traits;
  mpt_buffer *buf;
  mpt_slice *s_local;
  
  pmVar1 = (s->_a)._buf;
  if ((pmVar1 == (mpt_buffer *)0x0) || (local_40 = pmVar1->_used - s->_off, (long)local_40 < 0)) {
    s_local._4_4_ = -0x10;
  }
  else {
    pmVar2 = pmVar1->_content_traits;
    if ((pmVar2 == (mpt_type_traits *)0x0) || (pmVar2->size == 0)) {
      s_local._4_4_ = -1;
    }
    else if ((s->_len == 0) || (local_40 = local_40 - s->_len, local_40 != 0)) {
      if ((long)local_40 < (long)pmVar2->size) {
        s_local._4_4_ = -0x10;
      }
      else if (pmVar2->size == 1) {
        pmVar3 = mpt_type_traits(99);
        if (pmVar2 == pmVar3) {
          __s = (void *)((long)&pmVar1[1]._vptr + s->_len + s->_off);
          pvVar4 = memchr(__s,0,local_40);
          if (pvVar4 != (void *)0x0) {
            local_40 = (long)pvVar4 + (1 - (long)__s);
          }
          s->_off = s->_len + s->_off;
          s->_len = local_40;
          s_local._4_4_ = 0x43;
          if (pvVar4 != (void *)0x0) {
            s_local._4_4_ = 0x73;
          }
        }
        else {
          s->_off = s->_len + s->_off;
          s->_len = 1;
          s_local._4_4_ = 0x40;
        }
      }
      else if (s->_off % pmVar2->size == 0) {
        if ((long)(local_40 - pmVar2->size) < 0) {
          s_local._4_4_ = -0x10;
        }
        else {
          s->_off = s->_len + s->_off;
          s->_len = pmVar2->size;
          s_local._4_4_ = 0x40;
        }
      }
      else {
        s_local._4_4_ = -2;
      }
    }
    else {
      s->_off = s->_len + s->_off;
      s->_len = 0;
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

extern int mpt_slice_next(MPT_STRUCT(slice) *s)
{
	const MPT_STRUCT(buffer) *buf;
	const MPT_STRUCT(type_traits) *traits;
	const char *base, *end;
	ssize_t len;
	
	/* no remaining data */
	if (!(buf = s->_a._buf)
	  || (len = buf->_used - s->_off) < 0) {
		return MPT_ERROR(MissingData);
	}
	if (!(traits = buf->_content_traits) || !traits->size) {
		return MPT_ERROR(BadArgument);
	}
	/* consume existing segment */
	if (s->_len) {
		len -= s->_len;
		if (!len) {
			s->_off += s->_len;
			s->_len = 0;
			return 0;
		}
	}
	if (len < (ssize_t) traits->size) {
		return MPT_ERROR(MissingData);
	}
	/* alignment of data is required */
	if (traits->size != 1) {
		if (s->_off % traits->size) {
			return MPT_ERROR(BadValue);
		}
		len -= traits->size;
		if (len < 0) {
			return MPT_ERROR(MissingData);
		}
		s->_off += s->_len;
		s->_len = traits->size;
		return MPT_ENUM(TypeVector);
	}
	/* next byte of remaining data */
	if (traits != mpt_type_traits('c')) {
		s->_off += s->_len;
		s->_len = 1;
		return MPT_ENUM(TypeVector);
	}
	/* element base address and range */
	base = ((char *) (buf + 1)) + s->_off + s->_len;
	if ((end = memchr(base, 0, len))) {
		len = end + 1 - base;
	}
	s->_off += s->_len;
	s->_len = len;
	return end ? 's' : MPT_type_toVector('c');
}